

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

void __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::erase
          (InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *this,Block **k)

{
  size_t *psVar1;
  void *pvVar2;
  __node_base_ptr p_Var3;
  _Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
  __it;
  
  __it._M_cur = (__node_type *)0x0;
  p_Var3 = std::
           _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,(ulong)*k % (this->Map)._M_h._M_bucket_count,k,(__hash_code)*k);
  if (p_Var3 != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)p_Var3->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    pvVar2 = *(void **)((long)__it._M_cur + 0x10);
    psVar1 = &(this->List).
              super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar2,0x20);
    std::
    _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this,(const_iterator)__it._M_cur);
    return;
  }
  return;
}

Assistant:

void erase(const Key& k) {
    auto it = Map.find(k);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }